

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

S1Interval __thiscall S1Interval::Union(S1Interval *this,S1Interval *y)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  double lo;
  double hi;
  S1Interval SVar5;
  S1Interval local_68;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  local_48 = (y->bounds_).c_[0];
  local_58 = (y->bounds_).c_[1];
  if ((((local_48 != 3.141592653589793) || (NAN(local_48))) || (local_58 != -3.141592653589793)) ||
     (NAN(local_58))) {
    uStack_40 = 0;
    uStack_50 = 0;
    bVar1 = FastContains(this,local_48);
    bVar2 = FastContains(this,local_58);
    if (!bVar1) {
      if (bVar2) {
        lo = local_48;
        hi = (this->bounds_).c_[1];
LAB_001e5396:
        S1Interval(&local_68,lo,hi,ARGS_CHECKED);
        return (Vector2_d)local_68.bounds_.c_;
      }
      local_28 = (this->bounds_).c_[0];
      local_38 = (this->bounds_).c_[1];
      if (((local_28 != 3.141592653589793) || (NAN(local_28))) ||
         ((local_38 != -3.141592653589793 || (NAN(local_38))))) {
        uStack_20 = 0;
        uStack_30 = 0;
        bVar1 = FastContains(y,local_28);
        if (!bVar1) {
          uVar3 = -(ulong)(local_28 - local_58 < 0.0);
          uVar4 = -(ulong)(local_48 - local_38 < 0.0);
          lo = local_28;
          hi = local_58;
          if ((double)(~uVar3 & (ulong)(local_28 - local_58) |
                      (ulong)((local_28 + 3.141592653589793) - (local_58 + -3.141592653589793)) &
                      uVar3) <
              (double)(~uVar4 & (ulong)(local_48 - local_38) |
                      (ulong)((local_48 + 3.141592653589793) - (local_38 + -3.141592653589793)) &
                      uVar4)) {
            lo = local_48;
            hi = local_38;
          }
          goto LAB_001e5396;
        }
      }
      local_68.bounds_.c_[0] = (y->bounds_).c_[0];
      local_68.bounds_.c_[1] = (y->bounds_).c_[1];
      goto LAB_001e531e;
    }
    if (!bVar2) {
      lo = (this->bounds_).c_[0];
      hi = local_58;
      goto LAB_001e5396;
    }
    bVar1 = Contains(this,y);
    if (!bVar1) {
      SVar5 = Full();
      return (Vector2_d)SVar5.bounds_.c_;
    }
  }
  local_68.bounds_.c_[0] = (this->bounds_).c_[0];
  local_68.bounds_.c_[1] = (this->bounds_).c_[1];
LAB_001e531e:
  return (Vector2_d)(Vector2_d)local_68;
}

Assistant:

S1Interval S1Interval::Union(const S1Interval& y) const {
  // The y.is_full() case is handled correctly in all cases by the code
  // below, but can follow three separate code paths depending on whether
  // this interval is inverted, is non-inverted but contains Pi, or neither.

  if (y.is_empty()) return *this;
  if (FastContains(y.lo())) {
    if (FastContains(y.hi())) {
      // Either this interval contains y, or the union of the two
      // intervals is the Full() interval.
      if (Contains(y)) return *this;  // is_full() code path
      return Full();
    }
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
  if (FastContains(y.hi())) return S1Interval(y.lo(), hi(), ARGS_CHECKED);

  // This interval contains neither endpoint of y.  This means that either y
  // contains all of this interval, or the two intervals are disjoint.
  if (is_empty() || y.FastContains(lo())) return y;

  // Check which pair of endpoints are closer together.
  double dlo = PositiveDistance(y.hi(), lo());
  double dhi = PositiveDistance(hi(), y.lo());
  if (dlo < dhi) {
    return S1Interval(y.lo(), hi(), ARGS_CHECKED);
  } else {
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
}